

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O0

FT_Error bdf_list_ensure_(bdf_list_t_ *list,unsigned_long num_items)

{
  ulong cur_count;
  FT_Pointer pvVar1;
  FT_Memory memory;
  unsigned_long bigsize;
  unsigned_long newsize;
  unsigned_long oldsize;
  unsigned_long uStack_18;
  FT_Error error;
  unsigned_long num_items_local;
  bdf_list_t_ *list_local;
  
  oldsize._4_4_ = 0;
  if (list->size < num_items) {
    cur_count = list->size;
    bigsize = cur_count + (cur_count >> 1) + 5;
    if (cur_count == 0xfffffff) {
      oldsize._4_4_ = 0x40;
    }
    else {
      if ((bigsize < cur_count) || (0xfffffff < bigsize)) {
        bigsize = 0xfffffff;
      }
      uStack_18 = num_items;
      num_items_local = (unsigned_long)list;
      pvVar1 = ft_mem_qrealloc(list->memory,8,cur_count,bigsize,list->field,
                               (FT_Error *)((long)&oldsize + 4));
      *(FT_Pointer *)num_items_local = pvVar1;
      if (oldsize._4_4_ == 0) {
        *(unsigned_long *)(num_items_local + 8) = bigsize;
      }
    }
  }
  return oldsize._4_4_;
}

Assistant:

static FT_Error
  bdf_list_ensure_( bdf_list_t_*   list,
                    unsigned long  num_items ) /* same as bdf_list_t_.used */
  {
    FT_Error  error = FT_Err_Ok;


    if ( num_items > list->size )
    {
      unsigned long  oldsize = list->size; /* same as bdf_list_t_.size */
      unsigned long  newsize = oldsize + ( oldsize >> 1 ) + 5;
      unsigned long  bigsize = (unsigned long)( FT_INT_MAX / sizeof ( char* ) );
      FT_Memory      memory  = list->memory;


      if ( oldsize == bigsize )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }
      else if ( newsize < oldsize || newsize > bigsize )
        newsize = bigsize;

      if ( FT_QRENEW_ARRAY( list->field, oldsize, newsize ) )
        goto Exit;

      list->size = newsize;
    }

  Exit:
    return error;
  }